

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  int64_t lmicros;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int64_t *piVar11;
  int64_t lmicros_1;
  long lVar12;
  long lVar13;
  int64_t ldays;
  long lVar14;
  ulong uVar15;
  idx_t iVar16;
  int64_t *local_78;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar13 = ldata->micros;
      lVar10._0_4_ = ldata->months;
      lVar10._4_4_ = ldata->days;
      lVar14 = (lVar10 >> 0x20) + lVar13 / 86400000000;
      lVar12 = lVar14 % 0x1e;
      lVar10 = (long)(int)(undefined4)lVar10 + lVar14 / 0x1e;
      local_78 = &rdata->micros;
      iVar16 = 0;
      do {
        lVar14._0_4_ = ((interval_t *)(local_78 + -1))->months;
        lVar14._4_4_ = ((interval_t *)(local_78 + -1))->days;
        lVar9 = (lVar14 >> 0x20) + *local_78 / 86400000000;
        lVar14 = (long)(int)(undefined4)lVar14 + lVar9 / 0x1e;
        bVar4 = true;
        if (lVar10 <= lVar14) {
          if (lVar10 < lVar14) {
            bVar4 = false;
          }
          else {
            lVar9 = lVar9 % 0x1e;
            if (lVar12 <= lVar9) {
              bVar4 = *local_78 % 86400000000 < lVar13 % 86400000000 && lVar9 <= lVar12;
            }
          }
        }
        result_data[iVar16] = bVar4;
        iVar16 = iVar16 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar2 = puVar1[uVar5];
      uVar15 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar15 = count;
      }
      uVar6 = uVar15;
      if (uVar2 != 0) {
        uVar6 = uVar7;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar7 < uVar15) {
            lVar13 = ldata->micros;
            lVar9._0_4_ = ldata->months;
            lVar9._4_4_ = ldata->days;
            lVar10 = (lVar9 >> 0x20) + lVar13 / 86400000000;
            lVar14 = lVar10 % 0x1e;
            lVar10 = (long)(int)(undefined4)lVar9 + lVar10 / 0x1e;
            piVar11 = &rdata[uVar7].micros;
            do {
              lVar3._0_4_ = ((interval_t *)(piVar11 + -1))->months;
              lVar3._4_4_ = ((interval_t *)(piVar11 + -1))->days;
              lVar12 = (lVar3 >> 0x20) + *piVar11 / 86400000000;
              lVar9 = (long)(int)(undefined4)lVar3 + lVar12 / 0x1e;
              bVar4 = true;
              if (lVar10 <= lVar9) {
                if (lVar10 < lVar9) {
                  bVar4 = false;
                }
                else {
                  lVar12 = lVar12 % 0x1e;
                  if (lVar14 <= lVar12) {
                    bVar4 = *piVar11 % 86400000000 < lVar13 % 86400000000 && lVar12 <= lVar14;
                  }
                }
              }
              result_data[uVar6] = bVar4;
              uVar6 = uVar6 + 1;
              piVar11 = piVar11 + 2;
            } while (uVar15 != uVar6);
          }
        }
        else if (uVar7 < uVar15) {
          piVar11 = &rdata[uVar7].micros;
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              lVar13._0_4_ = ldata->months;
              lVar13._4_4_ = ldata->days;
              lVar12._0_4_ = ((interval_t *)(piVar11 + -1))->months;
              lVar12._4_4_ = ((interval_t *)(piVar11 + -1))->days;
              lVar14 = (lVar13 >> 0x20) + ldata->micros / 86400000000;
              lVar10 = (long)(int)(undefined4)lVar13 + lVar14 / 0x1e;
              lVar13 = (lVar12 >> 0x20) + *piVar11 / 86400000000;
              lVar12 = (long)(int)(undefined4)lVar12 + lVar13 / 0x1e;
              bVar4 = true;
              if (lVar10 <= lVar12) {
                if (lVar10 < lVar12) {
                  bVar4 = false;
                }
                else {
                  lVar14 = lVar14 % 0x1e;
                  lVar13 = lVar13 % 0x1e;
                  bVar4 = true;
                  if (lVar14 <= lVar13) {
                    bVar4 = *piVar11 % 86400000000 < ldata->micros % 86400000000 && lVar13 <= lVar14
                    ;
                  }
                }
              }
              result_data[uVar7] = bVar4;
            }
            uVar7 = uVar7 + 1;
            piVar11 = piVar11 + 2;
            uVar8 = uVar8 + 1;
            uVar6 = uVar7;
          } while (uVar15 != uVar7);
        }
      }
      uVar5 = uVar5 + 1;
      uVar7 = uVar6;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}